

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFullTypeName(ParserImpl *this,string *name)

{
  bool bVar1;
  string *in_RSI;
  string part;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  byte in_stack_ffffffffffffff77;
  ParserImpl *this_00;
  string local_70 [16];
  string *in_stack_ffffffffffffffa0;
  ParserImpl *in_stack_ffffffffffffffa8;
  undefined1 local_39 [33];
  string *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  bVar1 = ConsumeIdentifier(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (bVar1) {
    do {
      this_00 = (ParserImpl *)local_39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_39 + 1),".",(allocator *)this_00);
      in_stack_ffffffffffffff77 =
           TryConsume(this_00,(string *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)
                                      ));
      std::__cxx11::string::~string((string *)(local_39 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_39);
      if ((in_stack_ffffffffffffff77 & 1) == 0) {
        local_1 = 1;
        break;
      }
      std::__cxx11::string::string(local_70);
      bVar1 = ConsumeIdentifier(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffff76 = bVar1;
      if (bVar1) {
        std::__cxx11::string::operator+=(local_18,".");
        std::__cxx11::string::operator+=(local_18,local_70);
      }
      else {
        local_1 = 0;
      }
      std::__cxx11::string::~string(local_70);
    } while (bVar1);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ConsumeFullTypeName(std::string* name) {
    DO(ConsumeIdentifier(name));
    while (TryConsume(".")) {
      std::string part;
      DO(ConsumeIdentifier(&part));
      *name += ".";
      *name += part;
    }
    return true;
  }